

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Gatherv(void *sendbuf,int sendcount,MPIABI_Datatype sendtype,void *recvbuf,
                  int *recvcounts,int *displs,MPIABI_Datatype recvtype,int root,MPIABI_Comm comm)

{
  int iVar1;
  
  iVar1 = MPI_Gatherv();
  return iVar1;
}

Assistant:

int MPIABI_Gatherv(
  const void * sendbuf,
  int sendcount,
  MPIABI_Datatype sendtype,
  void * recvbuf,
  const int * recvcounts,
  const int * displs,
  MPIABI_Datatype recvtype,
  int root,
  MPIABI_Comm comm
) {
  return MPI_Gatherv(
    sendbuf,
    sendcount,
    (MPI_Datatype)(WPI_Datatype)sendtype,
    recvbuf,
    recvcounts,
    displs,
    (MPI_Datatype)(WPI_Datatype)recvtype,
    root,
    (MPI_Comm)(WPI_Comm)comm
  );
}